

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O2

int pt_iscache_find(pt_image_section_cache *iscache,char *filename,uint64_t offset,uint64_t size,
                   uint64_t laddr)

{
  ushort uVar1;
  pt_iscache_entry *ppVar2;
  pt_section *section;
  int iVar3;
  int iVar4;
  char *__s1;
  uint64_t uVar5;
  uint64_t uVar6;
  long lVar7;
  
  iVar3 = pt_iscache_lock(iscache);
  if (-1 < iVar3) {
    iVar3 = -1;
    if (filename != (char *)0x0 && iscache != (pt_image_section_cache *)0x0) {
      uVar1 = iscache->size;
      iVar3 = 1;
      for (lVar7 = 0; (ulong)uVar1 << 4 != lVar7; lVar7 = lVar7 + 0x10) {
        ppVar2 = iscache->entries;
        section = *(pt_section **)((long)&ppVar2->section + lVar7);
        __s1 = pt_section_filename(section);
        uVar5 = pt_section_offset(section);
        uVar6 = pt_section_size(section);
        if (((*(uint64_t *)((long)&ppVar2->laddr + lVar7) == laddr) && (uVar5 == offset)) &&
           (uVar6 == size)) {
          if (__s1 == (char *)0x0) {
            iVar3 = -1;
            goto LAB_0010a8a8;
          }
          iVar4 = strcmp(__s1,filename);
          if (iVar4 == 0) goto LAB_0010a8a8;
        }
        iVar3 = iVar3 + 1;
      }
      iVar3 = 0;
    }
LAB_0010a8a8:
    iVar4 = pt_iscache_unlock(iscache);
    if (iVar4 < 0) {
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

int pt_iscache_find(struct pt_image_section_cache *iscache,
		    const char *filename, uint64_t offset, uint64_t size,
		    uint64_t laddr)
{
	int errcode, isid;

	errcode = pt_iscache_lock(iscache);
	if (errcode < 0)
		return errcode;

	isid = pt_iscache_find_locked(iscache, filename, offset, size, laddr);

	errcode = pt_iscache_unlock(iscache);
	if (errcode < 0)
		return errcode;

	return isid;
}